

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O0

int Gia_TransferMappedClasses(Gia_Man_t *pPart,int *pMapBack,int *pReprs)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_40;
  int nClasses;
  int Id2;
  int Id1;
  int i;
  Gia_Obj_t *pObj;
  int *pReprs_local;
  int *pMapBack_local;
  Gia_Man_t *pPart_local;
  
  if (pPart->pReprs == (Gia_Rpr_t *)0x0) {
    pPart_local._4_4_ = 0;
  }
  else {
    local_40 = 0;
    Id2 = 0;
    while( true ) {
      bVar4 = false;
      if (Id2 < pPart->nObjs) {
        pGVar3 = Gia_ManObj(pPart,Id2);
        bVar4 = pGVar3 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjRepr(pPart,Id2);
      if (iVar1 != 0xfffffff) {
        iVar1 = Gia_ManObjNum(pPart);
        if (iVar1 <= Id2) {
          __assert_fail("i < Gia_ManObjNum(pPart)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                        ,0xd7,"int Gia_TransferMappedClasses(Gia_Man_t *, int *, int *)");
        }
        iVar1 = Gia_ObjRepr(pPart,Id2);
        iVar2 = Gia_ManObjNum(pPart);
        if (iVar2 <= iVar1) {
          __assert_fail("Gia_ObjRepr(pPart, i) < Gia_ManObjNum(pPart)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                        ,0xd8,"int Gia_TransferMappedClasses(Gia_Man_t *, int *, int *)");
        }
        iVar1 = pMapBack[Id2];
        iVar2 = Gia_ObjRepr(pPart,Id2);
        iVar2 = pMapBack[iVar2];
        if (iVar1 != iVar2) {
          if (iVar1 < iVar2) {
            pReprs[iVar2] = iVar1;
          }
          else {
            pReprs[iVar1] = iVar2;
          }
          local_40 = local_40 + 1;
        }
      }
      Id2 = Id2 + 1;
    }
    pPart_local._4_4_ = local_40;
  }
  return pPart_local._4_4_;
}

Assistant:

int Gia_TransferMappedClasses( Gia_Man_t * pPart, int * pMapBack, int * pReprs )
{
    Gia_Obj_t * pObj;
    int i, Id1, Id2, nClasses;
    if ( pPart->pReprs == NULL ) 
        return 0;
    nClasses = 0;
    Gia_ManForEachObj( pPart, pObj, i )
    {
        if ( Gia_ObjRepr(pPart, i) == GIA_VOID )
            continue;
        assert( i                     < Gia_ManObjNum(pPart) );
        assert( Gia_ObjRepr(pPart, i) < Gia_ManObjNum(pPart) );
        Id1 = pMapBack[ i ];
        Id2 = pMapBack[ Gia_ObjRepr(pPart, i) ];
        if ( Id1 == Id2 )
            continue;
        if ( Id1 < Id2 )
            pReprs[Id2] = Id1;
        else
            pReprs[Id1] = Id2;
        nClasses++;
    }
    return nClasses;
}